

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelPackage.cpp
# Opt level: O0

string * __thiscall
MPL::detail::ModelPackageImpl::addItem
          (string *__return_storage_ptr__,ModelPackageImpl *this,path *path,string *name,
          string *author,string *description)

{
  bool bVar1;
  runtime_error *this_00;
  string local_158;
  undefined1 local_131;
  path local_130;
  undefined1 local_108 [8];
  path dstPath;
  path filePath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [24];
  string *description_local;
  string *author_local;
  string *name_local;
  path *path_local;
  ModelPackageImpl *this_local;
  string *identifier;
  
  local_48._16_8_ = description;
  description_local = author;
  author_local = name;
  name_local = &path->_M_pathname;
  path_local = &this->m_packagePath;
  this_local = (ModelPackageImpl *)__return_storage_ptr__;
  findItem((ModelPackageImpl *)local_48,(string *)this,name);
  bVar1 = std::operator!=((shared_ptr<MPL::ModelPackageItemInfo> *)local_48,(nullptr_t)0x0);
  std::shared_ptr<MPL::ModelPackageItemInfo>::~shared_ptr
            ((shared_ptr<MPL::ModelPackageItemInfo> *)local_48);
  if (bVar1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_a8,"The package already contains a file with name: ",author_local);
    std::operator+(&local_88,&local_a8," author: ");
    std::operator+(&local_68,&local_88,description_local);
    std::runtime_error::runtime_error(this_00,(string *)&local_68);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  getItemPath((path *)&dstPath._M_cmpts,this,author_local,description_local);
  std::filesystem::__cxx11::operator/
            ((path *)local_108,&this->m_packageDataDirPath,(path *)&dstPath._M_cmpts);
  std::filesystem::__cxx11::path::parent_path();
  std::filesystem::create_directories(&local_130);
  std::filesystem::__cxx11::path::~path(&local_130);
  std::filesystem::copy((EVP_PKEY_CTX *)name_local,(EVP_PKEY_CTX *)local_108);
  local_131 = 0;
  generateIdentifier_abi_cxx11_(__return_storage_ptr__,this);
  std::filesystem::__cxx11::path::string(&local_158,(path *)&dstPath._M_cmpts);
  createItemInfoEntry(this,__return_storage_ptr__,&local_158,author_local,description_local,
                      (string *)local_48._16_8_);
  std::__cxx11::string::~string((string *)&local_158);
  local_131 = 1;
  std::filesystem::__cxx11::path::~path((path *)local_108);
  std::filesystem::__cxx11::path::~path((path *)&dstPath._M_cmpts);
  return __return_storage_ptr__;
}

Assistant:

std::string ModelPackageImpl::addItem(const std::filesystem::path& path, const std::string& name, const std::string& author, const std::string& description)
{
    if (findItem(name, author) != nullptr) {
        throw std::runtime_error("The package already contains a file with name: " + name + " author: " + author);
    }
    
    auto filePath = getItemPath(name, author);
    auto dstPath = m_packageDataDirPath / filePath;
    
    create_directories(dstPath.parent_path());
    std::filesystem::copy(path, dstPath);
    
    auto identifier = generateIdentifier();
    createItemInfoEntry(identifier, filePath.string(), name, author, description);
    return identifier;
}